

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O1

void MyCompiler::traverseIdentsFactor
               (Factor *ast,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *usedIdents)

{
  int iVar1;
  __node_gen_type __node_gen;
  
  iVar1 = (ast->super_AbstractAstNode).caseNum;
  if (iVar1 == 0) {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)usedIdents,
               &(((ast->pIdent).super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_AbstractAstNode).value);
  }
  else if (iVar1 == 2) {
    traverseIdentsExpression
              ((ast->pExpression).
               super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               usedIdents);
    return;
  }
  return;
}

Assistant:

void MyCompiler::traverseIdentsFactor(MyCompiler::Factor &ast,
                                      std::unordered_set<std::string> &usedIdents)
{
    switch (ast.caseNum)
    {
        case 2:
            return traverseIdentsExpression(*ast.pExpression, usedIdents);
        case 0:
            usedIdents.insert(ast.pIdent->value);
    }
}